

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O3

void secp256k1_fe_from_signed62(secp256k1_fe *r,secp256k1_modinv64_signed62 *a)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  ulong uVar5;
  uint64_t *puVar6;
  ulong uVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong uVar8;
  ulong *extraout_RDX;
  long lVar9;
  uint64_t uVar10;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_fe *a_01;
  secp256k1_fe *psVar11;
  long lVar12;
  secp256k1_modinv64_signed62 *psVar13;
  secp256k1_fe *a_02;
  secp256k1_modinv64_signed62 *a_03;
  uint64_t *puVar14;
  long lVar15;
  ulong uVar16;
  secp256k1_fe *psVar17;
  secp256k1_fe *psVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint64_t *puVar23;
  ulong uVar24;
  secp256k1_fe *psVar25;
  secp256k1_fe *psVar26;
  ulong uVar27;
  secp256k1_fe *unaff_R15;
  ulong uVar28;
  bool bVar29;
  secp256k1_modinv64_signed62 sStack_118;
  secp256k1_modinv64_signed62 sStack_f0;
  secp256k1_fe *psStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_fe *psStack_b8;
  ulong uStack_b0;
  secp256k1_fe *psStack_a8;
  ulong uStack_a0;
  secp256k1_fe *psStack_98;
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  uint64_t uStack_80;
  uint64_t uStack_78;
  secp256k1_fe *psStack_70;
  secp256k1_fe *psStack_68;
  uint64_t uStack_60;
  uint64_t uStack_58;
  secp256k1_fe *psStack_50;
  secp256k1_fe *psStack_48;
  uint64_t uStack_40;
  
  uVar8 = a->v[0];
  if (uVar8 >> 0x3e == 0) {
    uVar5 = a->v[1];
    if (0x3fffffffffffffff < uVar5) goto LAB_0011b7ac;
    uVar7 = a->v[2];
    if (0x3fffffffffffffff < uVar7) goto LAB_0011b7b1;
    uVar20 = a->v[3];
    if (0x3fffffffffffffff < uVar20) goto LAB_0011b7b6;
    uVar24 = a->v[4];
    if (uVar24 < 0x100) {
      r->n[0] = uVar8 & 0xfffffffffffff;
      r->n[1] = (uVar5 & 0x3ffffffffff) << 10 | uVar8 >> 0x34;
      r->n[2] = (uVar7 & 0xffffffff) << 0x14 | uVar5 >> 0x2a;
      r->n[3] = (ulong)((uint)uVar20 & 0x3fffff) << 0x1e | uVar7 >> 0x20;
      r->n[4] = uVar24 << 0x28 | uVar20 >> 0x16;
      return;
    }
  }
  else {
    secp256k1_fe_from_signed62_cold_5();
LAB_0011b7ac:
    secp256k1_fe_from_signed62_cold_4();
LAB_0011b7b1:
    secp256k1_fe_from_signed62_cold_3();
LAB_0011b7b6:
    secp256k1_fe_from_signed62_cold_2();
  }
  secp256k1_fe_from_signed62_cold_1();
  uVar10 = r->n[0];
  psStack_48 = (secp256k1_fe *)r->n[1];
  uStack_58 = r->n[2];
  uStack_60 = r->n[3];
  uStack_80 = r->n[4];
  psVar26 = (secp256k1_fe *)((secp256k1_fe *)a)->n[0];
  uStack_40 = ((secp256k1_fe *)a)->n[1];
  psStack_68 = (secp256k1_fe *)((secp256k1_fe *)a)->n[2];
  psStack_50 = (secp256k1_fe *)((secp256k1_fe *)a)->n[3];
  uStack_a0 = *extraout_RDX;
  psStack_98 = (secp256k1_fe *)extraout_RDX[1];
  uStack_b0 = extraout_RDX[2];
  psStack_a8 = (secp256k1_fe *)extraout_RDX[3];
  uStack_78 = ((secp256k1_fe *)a)->n[4];
  psVar11 = (secp256k1_fe *)0x5;
  uVar8 = 0xfffffffffffffffe;
  psStack_b8 = (secp256k1_fe *)0x11b85c;
  a_02 = r;
  iVar2 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)r,5,&secp256k1_const_modinfo_fe.modulus,-2);
  a_01 = r;
  if (iVar2 < 1) {
LAB_0011c0f6:
    psStack_b8 = (secp256k1_fe *)0x11c0fb;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0011c0fb:
    psStack_b8 = (secp256k1_fe *)0x11c100;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0011c100:
    psStack_b8 = (secp256k1_fe *)0x11c105;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0011c105:
    psStack_b8 = (secp256k1_fe *)0x11c10a;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0011c10a:
    psStack_b8 = (secp256k1_fe *)0x11c10f;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0011c10f:
    psStack_b8 = (secp256k1_fe *)0x11c114;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_0011c114:
    psStack_b8 = (secp256k1_fe *)0x11c119;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0011c119:
    psStack_b8 = (secp256k1_fe *)0x11c11e;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0011c11e:
    psStack_b8 = (secp256k1_fe *)0x11c123;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0011c123:
    psStack_b8 = (secp256k1_fe *)0x11c128;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0011c128:
    psStack_b8 = (secp256k1_fe *)0x11c12d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0011c12d:
    psStack_b8 = (secp256k1_fe *)0x11c132;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_0011c132:
    psStack_b8 = (secp256k1_fe *)0x11c137;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0011c137:
    psStack_b8 = (secp256k1_fe *)0x11c13c;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_0011c13c:
    psStack_b8 = (secp256k1_fe *)0x11c141;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0011c141:
    psStack_b8 = (secp256k1_fe *)0x11c146;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0011c146:
    psStack_b8 = (secp256k1_fe *)0x11c14b;
    secp256k1_modinv64_update_de_62_cold_22();
  }
  else {
    uVar8 = 1;
    psVar11 = (secp256k1_fe *)0x5;
    psStack_b8 = (secp256k1_fe *)0x11b87d;
    a_02 = r;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)r,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_0011c0fb;
    psVar11 = (secp256k1_fe *)0x5;
    uVar8 = 0xfffffffffffffffe;
    psStack_b8 = (secp256k1_fe *)0x11b8a0;
    a_02 = (secp256k1_fe *)a;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar2 < 1) goto LAB_0011c100;
    uVar8 = 1;
    psVar11 = (secp256k1_fe *)0x5;
    psStack_b8 = (secp256k1_fe *)0x11b8c1;
    a_02 = (secp256k1_fe *)a;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_0011c105;
    psStack_b8 = (secp256k1_fe *)0x11b8dd;
    unaff_R15 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_a0);
    psStack_b8 = (secp256k1_fe *)0x11b8ea;
    a_02 = psStack_98;
    iVar4 = secp256k1_modinv64_abs((int64_t)psStack_98);
    uVar8 = 0x4000000000000000 - iVar4;
    if ((long)uVar8 < (long)unaff_R15) goto LAB_0011c10a;
    psStack_b8 = (secp256k1_fe *)0x11b905;
    unaff_R15 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_b0);
    psStack_b8 = (secp256k1_fe *)0x11b912;
    a_02 = psStack_a8;
    iVar4 = secp256k1_modinv64_abs((int64_t)psStack_a8);
    uVar8 = 0x4000000000000000 - iVar4;
    if ((long)uVar8 < (long)unaff_R15) goto LAB_0011c10f;
    psVar11 = (secp256k1_fe *)(uStack_a0 * uVar10);
    uVar8 = SUB168(SEXT816((long)uStack_a0) * SEXT816((long)uVar10),8);
    uVar5 = (long)psStack_98 * (long)psVar26;
    lVar9 = SUB168(SEXT816((long)psStack_98) * SEXT816((long)psVar26),8);
    a_01 = (secp256k1_fe *)0x7fffffffffffffff;
    a_02 = (secp256k1_fe *)~uVar5;
    lVar12 = (0x7fffffffffffffff - lVar9) - uVar8;
    psStack_88 = r;
    if ((SBORROW8(0x7fffffffffffffff - lVar9,uVar8) != SBORROW8(lVar12,(ulong)(a_02 < psVar11))) !=
        (long)(lVar12 - (ulong)(a_02 < psVar11)) < 0 && -1 < lVar9) goto LAB_0011c146;
    puVar6 = (uint64_t *)((long)psVar11->n + uVar5);
    psVar17 = (secp256k1_fe *)(lVar9 + uVar8 + (ulong)CARRY8(uVar5,(ulong)psVar11));
    unaff_R15 = (secp256k1_fe *)(uStack_b0 * uVar10);
    lVar9 = SUB168(SEXT816((long)uStack_b0) * SEXT816((long)uVar10),8);
    uVar5 = (long)psStack_a8 * (long)psVar26;
    a_02 = SUB168(SEXT816((long)psStack_a8) * SEXT816((long)psVar26),8);
    uVar8 = (ulong)((secp256k1_fe *)(-uVar5 - 1) < unaff_R15);
    lVar12 = (0x7fffffffffffffff - (long)a_02) - lVar9;
    bVar29 = (SBORROW8(0x7fffffffffffffff - (long)a_02,lVar9) != SBORROW8(lVar12,uVar8)) !=
             (long)(lVar12 - uVar8) < 0;
    uVar8 = CONCAT71((int7)(-uVar5 - 1 >> 8),bVar29 && -1 < (long)a_02);
    if (!bVar29 || -1 >= (long)a_02) {
      puVar23 = (uint64_t *)((long)uStack_80 >> 0x3f);
      uVar8 = (long)uStack_78 >> 0x3f;
      lVar12 = ((ulong)psStack_98 & uVar8) + (uStack_a0 & (ulong)puVar23);
      psVar26 = (secp256k1_fe *)0xfffffffefffffc2f;
      puVar14 = (uint64_t *)((long)unaff_R15->n + uVar5);
      a_02 = (secp256k1_fe *)((long)a_02->n + (ulong)CARRY8(uVar5,(ulong)unaff_R15) + lVar9);
      uVar5 = 0x27c7f6e22ddacacf;
      psVar11 = (secp256k1_fe *)
                (lVar12 - ((long)puVar6 * 0x27c7f6e22ddacacf + lVar12 & 0x3fffffffffffffffU));
      unaff_R15 = (secp256k1_fe *)((long)psVar11 * -0x1000003d1);
      uVar10 = SUB168(SEXT816((long)psVar11) * SEXT816(-0x1000003d1),8);
      psStack_90 = (secp256k1_fe *)a;
      if (0 < (long)psVar11) {
        lVar9 = (-0x8000000000000000 - uVar10) - (ulong)(unaff_R15 != (secp256k1_fe *)0x0);
        uVar7 = (ulong)(puVar6 < (undefined1 *)((long)psVar11 * 0x1000003d1));
        lVar12 = (long)psVar17 - lVar9;
        if ((SBORROW8((long)psVar17,lVar9) != SBORROW8(lVar12,uVar7)) == (long)(lVar12 - uVar7) < 0)
        goto LAB_0011ba4b;
LAB_0011bba5:
        psStack_b8 = (secp256k1_fe *)0x11bbaa;
        secp256k1_modinv64_update_de_62_cold_20();
LAB_0011bbaa:
        uVar7 = (ulong)((undefined1 *)(-(long)puVar6 - 1U) < puVar14);
        lVar12 = (0x7fffffffffffffff - (long)psVar26) - (long)a_02;
        psVar18 = psVar17;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar26,(long)a_02) != SBORROW8(lVar12,uVar7)) !=
            (long)(lVar12 - uVar7) < 0) goto LAB_0011bbc6;
LAB_0011baba:
        bVar29 = CARRY8((ulong)puVar6,(ulong)puVar14);
        puVar6 = (uint64_t *)((long)puVar14 + (long)puVar6);
        psVar26 = (secp256k1_fe *)((long)a_02->n + (ulong)bVar29 + (long)psVar26->n);
        if (((ulong)unaff_R15 & 0x3fffffffffffffff) != 0) goto LAB_0011c114;
        if (((ulong)puVar6 & 0x3fffffffffffffff) == 0) {
          unaff_R15 = (secp256k1_fe *)((ulong)unaff_R15 >> 0x3e | uVar10 << 2);
          puVar23 = (uint64_t *)((long)unaff_R15->n + uStack_a0 * (long)psStack_48);
          uVar5 = SUB168(SEXT816((long)uStack_a0) * SEXT816((long)psStack_48),8) +
                  ((long)uVar10 >> 0x3e) +
                  (ulong)CARRY8(uStack_a0 * (long)psStack_48,(ulong)unaff_R15);
          uVar7 = (long)psStack_98 * uStack_40;
          lVar12 = SUB168(SEXT816((long)psStack_98) * SEXT816((long)uStack_40),8);
          psVar17 = psStack_48;
          uVar10 = uStack_40;
          psStack_70 = psVar18;
          if (lVar12 < 0) goto LAB_0011bbcb;
          uVar20 = (ulong)((undefined1 *)(-1 - uVar7) < puVar23);
          lVar9 = (0x7fffffffffffffff - lVar12) - uVar5;
          if ((SBORROW8(0x7fffffffffffffff - lVar12,uVar5) != SBORROW8(lVar9,uVar20)) ==
              (long)(lVar9 - uVar20) < 0) goto LAB_0011bb3b;
          goto LAB_0011bbed;
        }
        goto LAB_0011c119;
      }
      uVar7 = (ulong)((undefined1 *)((long)psVar11 * 0x1000003d1 - 1U) < puVar6);
      lVar12 = (0x7fffffffffffffff - uVar10) - (long)psVar17;
      if ((SBORROW8(0x7fffffffffffffff - uVar10,(long)psVar17) != SBORROW8(lVar12,uVar7)) !=
          (long)(lVar12 - uVar7) < 0) goto LAB_0011bba5;
LAB_0011ba4b:
      lVar12 = (uVar8 & (ulong)psStack_a8) + ((ulong)puVar23 & uStack_b0);
      uVar5 = (long)puVar14 * 0x27c7f6e22ddacacf + lVar12 & 0x3fffffffffffffff;
      uVar8 = lVar12 - uVar5;
      bVar29 = CARRY8((ulong)unaff_R15,(ulong)puVar6);
      unaff_R15 = (secp256k1_fe *)((long)puVar6 + (long)unaff_R15->n);
      uVar10 = (long)psVar17->n + bVar29 + uVar10;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar8;
      puVar6 = SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),0);
      psVar17 = (secp256k1_fe *)((long)uVar8 >> 0x3f);
      puVar23 = (uint64_t *)(SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),8) - uVar8);
      psVar26 = (secp256k1_fe *)((long)psVar17 * -0x1000003d1 + (long)puVar23);
      if ((long)uVar8 < 1) goto LAB_0011bbaa;
      lVar9 = (-0x8000000000000000 - (long)psVar26) - (ulong)(puVar6 != (uint64_t *)0x0);
      lVar12 = (long)a_02 - lVar9;
      psVar18 = psVar17;
      if ((SBORROW8((long)a_02,lVar9) !=
          SBORROW8(lVar12,(ulong)(puVar14 < (undefined1 *)-(long)puVar6))) ==
          (long)(lVar12 - (ulong)(puVar14 < (undefined1 *)-(long)puVar6)) < 0) goto LAB_0011baba;
LAB_0011bbc6:
      psStack_b8 = (secp256k1_fe *)0x11bbcb;
      secp256k1_modinv64_update_de_62_cold_19();
      uVar7 = extraout_RAX;
      lVar12 = extraout_RDX_00;
LAB_0011bbcb:
      lVar21 = (-0x8000000000000000 - lVar12) - (ulong)(uVar7 != 0);
      lVar9 = uVar5 - lVar21;
      if ((SBORROW8(uVar5,lVar21) != SBORROW8(lVar9,(ulong)(puVar23 < (undefined1 *)-uVar7))) ==
          (long)(lVar9 - (ulong)(puVar23 < (undefined1 *)-uVar7)) < 0) {
LAB_0011bb3b:
        uVar20 = (ulong)puVar6 >> 0x3e | (long)psVar26 << 2;
        bVar29 = CARRY8((ulong)puVar23,uVar7);
        puVar23 = (uint64_t *)((long)puVar23 + uVar7);
        uVar5 = uVar5 + lVar12 + (ulong)bVar29;
        unaff_R15 = (secp256k1_fe *)(uStack_b0 * (long)psVar17 + uVar20);
        psVar17 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_b0) * SEXT816((long)psVar17),8) +
                   ((long)psVar26 >> 0x3e) + (ulong)CARRY8(uStack_b0 * (long)psVar17,uVar20));
        uVar7 = (long)psStack_a8 * uVar10;
        lVar12 = SUB168(SEXT816((long)psStack_a8) * SEXT816((long)uVar10),8);
        if (lVar12 < 0) goto LAB_0011bbf2;
        a_02 = (secp256k1_fe *)(-1 - uVar7);
        lVar9 = (0x7fffffffffffffff - lVar12) - (long)psVar17;
        bVar29 = SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar17) !=
                 SBORROW8(lVar9,(ulong)(a_02 < unaff_R15));
        psVar18 = (secp256k1_fe *)(lVar9 - (ulong)(a_02 < unaff_R15));
      }
      else {
LAB_0011bbed:
        psStack_b8 = (secp256k1_fe *)0x11bbf2;
        secp256k1_modinv64_update_de_62_cold_18();
        uVar7 = extraout_RAX_00;
        lVar12 = extraout_RDX_01;
LAB_0011bbf2:
        lVar21 = (-0x8000000000000000 - lVar12) - (ulong)(uVar7 != 0);
        lVar9 = (long)psVar17 - lVar21;
        bVar29 = SBORROW8((long)psVar17,lVar21) !=
                 SBORROW8(lVar9,(ulong)(unaff_R15 < (secp256k1_fe *)-uVar7));
        a_02 = (secp256k1_fe *)(lVar9 - (ulong)(unaff_R15 < (secp256k1_fe *)-uVar7));
        psVar18 = a_02;
      }
      psVar26 = psStack_68;
      psVar25 = psStack_90;
      if (bVar29 != (long)psVar18 < 0) goto LAB_0011c11e;
      uVar28 = (long)unaff_R15->n + uVar7;
      lVar21 = (long)psVar17->n + (ulong)CARRY8((ulong)unaff_R15,uVar7) + lVar12;
      uVar20 = uVar5 << 2 | (ulong)puVar23 >> 0x3e;
      uVar24 = (ulong)puVar23 & 0x3fffffffffffffff;
      uVar7 = uStack_a0 * uStack_58 + uVar20;
      lVar9 = SUB168(SEXT816((long)uStack_a0) * SEXT816((long)uStack_58),8) + ((long)uVar5 >> 0x3e)
              + (ulong)CARRY8(uStack_a0 * uStack_58,uVar20);
      psStack_88->n[0] = uVar24;
      uVar5 = (long)psStack_98 * (long)psStack_68;
      lVar12 = SUB168(SEXT816((long)psStack_98) * SEXT816((long)psStack_68),8);
      psStack_90->n[0] = uVar28 & 0x3fffffffffffffff;
      if (lVar12 < 0) {
        lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        if ((SBORROW8(lVar9,lVar22) != SBORROW8(lVar9 - lVar22,(ulong)(uVar7 < -uVar5))) !=
            (long)((lVar9 - lVar22) - (ulong)(uVar7 < -uVar5)) < 0) goto LAB_0011be8a;
LAB_0011bc88:
        uVar28 = uVar28 >> 0x3e | lVar21 * 4;
        bVar29 = CARRY8(uVar7,uVar5);
        uVar7 = uVar7 + uVar5;
        lVar9 = lVar9 + lVar12 + (ulong)bVar29;
        uVar24 = uStack_b0 * uStack_58 + uVar28;
        lVar22 = SUB168(SEXT816((long)uStack_b0) * SEXT816((long)uStack_58),8) + (lVar21 >> 0x3e) +
                 (ulong)CARRY8(uStack_b0 * uStack_58,uVar28);
        uVar5 = (long)psStack_a8 * (long)psStack_68;
        lVar12 = SUB168(SEXT816((long)psStack_a8) * SEXT816((long)psStack_68),8);
        if (lVar12 < 0) goto LAB_0011be8f;
        uVar20 = -uVar5 - 1;
        lVar15 = (0x7fffffffffffffff - lVar12) - lVar22;
        lVar21 = lVar15 - (ulong)(uVar20 < uVar24);
        if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar22) !=
            SBORROW8(lVar15,(ulong)(uVar20 < uVar24))) != lVar21 < 0) goto LAB_0011beb1;
LAB_0011bcd9:
        bVar29 = CARRY8(uVar24,uVar5);
        uVar24 = uVar24 + uVar5;
        lVar22 = lVar22 + lVar12 + (ulong)bVar29;
        uVar5 = lVar9 << 2 | uVar7 >> 0x3e;
        uVar28 = uVar24 & 0x3fffffffffffffff;
        uVar20 = uStack_a0 * uStack_60 + uVar5;
        lVar21 = SUB168(SEXT816((long)uStack_a0) * SEXT816((long)uStack_60),8) + (lVar9 >> 0x3e) +
                 (ulong)CARRY8(uStack_a0 * uStack_60,uVar5);
        psStack_88->n[1] = uVar7 & 0x3fffffffffffffff;
        uVar5 = (long)psStack_98 * (long)psStack_50;
        lVar12 = SUB168(SEXT816((long)psStack_98) * SEXT816((long)psStack_50),8);
        psVar25->n[1] = uVar28;
        psVar26 = psStack_50;
        if (lVar12 < 0) goto LAB_0011beb6;
        uVar7 = (ulong)(-uVar5 - 1 < uVar20);
        lVar9 = (0x7fffffffffffffff - lVar12) - lVar21;
        if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar21) != SBORROW8(lVar9,uVar7)) !=
            (long)(lVar9 - uVar7) < 0) goto LAB_0011bed8;
LAB_0011bd49:
        uVar7 = uVar24 >> 0x3e | lVar22 << 2;
        bVar29 = CARRY8(uVar20,uVar5);
        uVar20 = uVar20 + uVar5;
        lVar21 = lVar21 + lVar12 + (ulong)bVar29;
        psVar25 = (secp256k1_fe *)(uStack_b0 * uStack_60 + uVar7);
        uVar28 = SUB168(SEXT816((long)uStack_b0) * SEXT816((long)uStack_60),8) + (lVar22 >> 0x3e) +
                 (ulong)CARRY8(uStack_b0 * uStack_60,uVar7);
        uVar5 = (long)psStack_a8 * (long)psVar26;
        lVar12 = SUB168(SEXT816((long)psStack_a8) * SEXT816((long)psVar26),8);
        if (lVar12 < 0) goto LAB_0011bedd;
        a_02 = (secp256k1_fe *)(-1 - uVar5);
        lVar9 = (0x7fffffffffffffff - lVar12) - uVar28;
        uVar7 = lVar9 - (ulong)(a_02 < psVar25);
        if ((SBORROW8(0x7fffffffffffffff - lVar12,uVar28) != SBORROW8(lVar9,(ulong)(a_02 < psVar25))
            ) == (long)uVar7 < 0) goto LAB_0011bda4;
LAB_0011bf02:
        psStack_b8 = (secp256k1_fe *)0x11bf07;
        secp256k1_modinv64_update_de_62_cold_13();
        uVar5 = extraout_RAX_04;
        lVar12 = extraout_RDX_05;
LAB_0011bf07:
        lVar21 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        uVar20 = ((long)a_02 - lVar21) - (ulong)(uVar7 < -uVar5);
        if ((SBORROW8((long)a_02,lVar21) != SBORROW8((long)a_02 - lVar21,(ulong)(uVar7 < -uVar5)))
            == (long)uVar20 < 0) goto LAB_0011be16;
LAB_0011bf22:
        psStack_b8 = (secp256k1_fe *)0x11bf27;
        secp256k1_modinv64_update_de_62_cold_12();
        uVar5 = extraout_RAX_05;
        lVar12 = extraout_RDX_06;
LAB_0011bf27:
        lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        lVar9 = lVar21 - lVar22;
        bVar29 = SBORROW8(lVar21,lVar22) != SBORROW8(lVar9,(ulong)(uVar20 < -uVar5));
        lVar9 = lVar9 - (ulong)(uVar20 < -uVar5);
      }
      else {
        uVar20 = (ulong)(-uVar5 - 1 < uVar7);
        lVar15 = (0x7fffffffffffffff - lVar12) - lVar9;
        lVar22 = lVar15 - uVar20;
        if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar9) != SBORROW8(lVar15,uVar20)) == lVar22 < 0)
        goto LAB_0011bc88;
LAB_0011be8a:
        psStack_b8 = (secp256k1_fe *)0x11be8f;
        secp256k1_modinv64_update_de_62_cold_16();
        uVar5 = extraout_RAX_01;
        lVar12 = extraout_RDX_02;
LAB_0011be8f:
        lVar21 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        uVar20 = (lVar22 - lVar21) - (ulong)(uVar24 < -uVar5);
        if ((SBORROW8(lVar22,lVar21) != SBORROW8(lVar22 - lVar21,(ulong)(uVar24 < -uVar5))) ==
            (long)uVar20 < 0) goto LAB_0011bcd9;
LAB_0011beb1:
        psStack_b8 = (secp256k1_fe *)0x11beb6;
        secp256k1_modinv64_update_de_62_cold_15();
        uVar5 = extraout_RAX_02;
        lVar12 = extraout_RDX_03;
LAB_0011beb6:
        lVar15 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        lVar9 = lVar21 - lVar15;
        if ((SBORROW8(lVar21,lVar15) != SBORROW8(lVar9,(ulong)(uVar20 < -uVar5))) ==
            (long)(lVar9 - (ulong)(uVar20 < -uVar5)) < 0) goto LAB_0011bd49;
LAB_0011bed8:
        psStack_b8 = (secp256k1_fe *)0x11bedd;
        secp256k1_modinv64_update_de_62_cold_14();
        uVar5 = extraout_RAX_03;
        lVar12 = extraout_RDX_04;
LAB_0011bedd:
        uVar7 = (-0x8000000000000000 - lVar12) - (ulong)(uVar5 != 0);
        a_02 = (secp256k1_fe *)((uVar28 - uVar7) - (ulong)(psVar25 < (secp256k1_fe *)-uVar5));
        if ((SBORROW8(uVar28,uVar7) !=
            SBORROW8(uVar28 - uVar7,(ulong)(psVar25 < (secp256k1_fe *)-uVar5))) != (long)a_02 < 0)
        goto LAB_0011bf02;
LAB_0011bda4:
        bVar29 = CARRY8((ulong)psVar25,uVar5);
        psVar25 = (secp256k1_fe *)((long)psVar25->n + uVar5);
        uVar28 = uVar28 + lVar12 + (ulong)bVar29;
        uVar5 = lVar21 << 2 | uVar20 >> 0x3e;
        uVar7 = uStack_a0 * uStack_80 + uVar5;
        a_02 = (secp256k1_fe *)
               (SUB168(SEXT816((long)uStack_a0) * SEXT816((long)uStack_80),8) + (lVar21 >> 0x3e) +
               (ulong)CARRY8(uStack_a0 * uStack_80,uVar5));
        psStack_88->n[2] = uVar20 & 0x3fffffffffffffff;
        uVar5 = (long)psStack_98 * uStack_78;
        lVar12 = SUB168(SEXT816((long)psStack_98) * SEXT816((long)uStack_78),8);
        psStack_90->n[2] = (ulong)psVar25 & 0x3fffffffffffffff;
        if (lVar12 < 0) goto LAB_0011bf07;
        uVar20 = -uVar5 - 1;
        lVar9 = (0x7fffffffffffffff - lVar12) - (long)a_02;
        lVar21 = lVar9 - (ulong)(uVar20 < uVar7);
        if ((SBORROW8(0x7fffffffffffffff - lVar12,(long)a_02) !=
            SBORROW8(lVar9,(ulong)(uVar20 < uVar7))) != lVar21 < 0) goto LAB_0011bf22;
LAB_0011be16:
        uVar24 = (ulong)psVar25 >> 0x3e | uVar28 << 2;
        bVar29 = CARRY8(uVar7,uVar5);
        uVar7 = uVar7 + uVar5;
        a_02 = (secp256k1_fe *)((long)a_02->n + (ulong)bVar29 + lVar12);
        uVar20 = uStack_b0 * uStack_80 + uVar24;
        lVar21 = SUB168(SEXT816((long)uStack_b0) * SEXT816((long)uStack_80),8) +
                 ((long)uVar28 >> 0x3e) + (ulong)CARRY8(uStack_b0 * uStack_80,uVar24);
        uVar5 = (long)psStack_a8 * uStack_78;
        lVar12 = SUB168(SEXT816((long)psStack_a8) * SEXT816((long)uStack_78),8);
        if (lVar12 < 0) goto LAB_0011bf27;
        uVar24 = (ulong)(-uVar5 - 1 < uVar20);
        lVar9 = (0x7fffffffffffffff - lVar12) - lVar21;
        bVar29 = SBORROW8(0x7fffffffffffffff - lVar12,lVar21) != SBORROW8(lVar9,uVar24);
        lVar9 = lVar9 - uVar24;
      }
      unaff_R15 = psStack_70;
      psVar26 = psStack_90;
      if (bVar29 != lVar9 < 0) goto LAB_0011c123;
      uVar24 = uVar20 + uVar5;
      lVar12 = lVar21 + lVar12 + (ulong)CARRY8(uVar20,uVar5);
      uVar20 = ((long)psVar11 >> 0x3f) << 8 | (ulong)psVar11 >> 0x38;
      uVar5 = (long)psVar11 * 0x100;
      if ((long)psVar11 < 0) {
        uVar28 = (long)psVar11 * -0x100;
        psVar11 = (secp256k1_fe *)((-0x8000000000000000 - uVar20) - (ulong)(uVar5 != 0));
        uVar28 = (ulong)(uVar7 < uVar28);
        if ((SBORROW8((long)a_02,(long)psVar11) != SBORROW8((long)a_02 - (long)psVar11,uVar28)) !=
            (long)(((long)a_02 - (long)psVar11) - uVar28) < 0) goto LAB_0011c0d1;
LAB_0011bf8a:
        bVar29 = CARRY8(uVar7,uVar5);
        uVar7 = uVar7 + uVar5;
        a_02 = (secp256k1_fe *)((long)a_02->n + bVar29 + uVar20);
        unaff_R15 = (secp256k1_fe *)((long)psStack_70 << 8 | uVar8 >> 0x38);
        uVar5 = uVar8 * 0x100;
        if ((long)uVar8 < 0) goto LAB_0011c0d6;
        uVar8 = uVar8 * -0x100 - 1;
        lVar9 = (0x7fffffffffffffff - (long)unaff_R15) - lVar12;
        a_01 = (secp256k1_fe *)(lVar9 - (ulong)(uVar8 < uVar24));
        if ((SBORROW8(0x7fffffffffffffff - (long)unaff_R15,lVar12) !=
            SBORROW8(lVar9,(ulong)(uVar8 < uVar24))) != (long)a_01 < 0) goto LAB_0011c0f1;
      }
      else {
        uVar28 = (ulong)((long)psVar11 * -0x100 - 1U < uVar7);
        lVar9 = (0x7fffffffffffffff - uVar20) - (long)a_02;
        psVar11 = (secp256k1_fe *)(lVar9 - uVar28);
        if ((SBORROW8(0x7fffffffffffffff - uVar20,(long)a_02) != SBORROW8(lVar9,uVar28)) ==
            (long)psVar11 < 0) goto LAB_0011bf8a;
LAB_0011c0d1:
        psStack_b8 = (secp256k1_fe *)0x11c0d6;
        secp256k1_modinv64_update_de_62_cold_10();
        uVar5 = extraout_RAX_06;
LAB_0011c0d6:
        lVar21 = (-0x8000000000000000 - (long)unaff_R15) - (ulong)(uVar5 != 0);
        lVar9 = lVar12 - lVar21;
        uVar8 = lVar9 - (ulong)(uVar24 < -uVar5);
        if ((SBORROW8(lVar12,lVar21) != SBORROW8(lVar9,(ulong)(uVar24 < -uVar5))) != (long)uVar8 < 0
           ) {
LAB_0011c0f1:
          psStack_b8 = (secp256k1_fe *)0x11c0f6;
          secp256k1_modinv64_update_de_62_cold_9();
          goto LAB_0011c0f6;
        }
      }
      a_01 = psStack_88;
      lVar12 = (long)unaff_R15->n + (ulong)CARRY8(uVar24,uVar5) + lVar12;
      uVar20 = (long)a_02 << 2 | uVar7 >> 0x3e;
      psStack_88->n[3] = uVar7 & 0x3fffffffffffffff;
      psVar26->n[3] = uVar24 + uVar5 & 0x3fffffffffffffff;
      uVar8 = uVar20 + 0x8000000000000000;
      a_02 = (secp256k1_fe *)(((long)a_02 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar20));
      if (a_02 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_0011c128;
      uVar8 = 0xffffffffffffffff;
      uVar5 = uVar24 + uVar5 >> 0x3e | lVar12 * 4;
      psStack_88->n[4] = uVar20;
      if ((lVar12 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar5) != -1) goto LAB_0011c12d;
      psVar26->n[4] = uVar5;
      psVar11 = (secp256k1_fe *)0x5;
      uVar8 = 0xfffffffffffffffe;
      psStack_b8 = (secp256k1_fe *)0x11c03a;
      a_02 = psStack_88;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psStack_88,5,
                         &secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar2 < 1) goto LAB_0011c132;
      uVar8 = 1;
      psVar11 = (secp256k1_fe *)0x5;
      psStack_b8 = (secp256k1_fe *)0x11c05b;
      a_02 = a_01;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,&secp256k1_const_modinfo_fe.modulus,1
                        );
      if (-1 < iVar2) goto LAB_0011c137;
      psVar11 = (secp256k1_fe *)0x5;
      uVar8 = 0xfffffffffffffffe;
      psStack_b8 = (secp256k1_fe *)0x11c07e;
      a_02 = psVar26;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar26,5,
                         &secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar2 < 1) goto LAB_0011c13c;
      uVar8 = 1;
      psVar11 = (secp256k1_fe *)0x5;
      psStack_b8 = (secp256k1_fe *)0x11c09f;
      a_02 = psVar26;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar26,5,
                         &secp256k1_const_modinfo_fe.modulus,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_0011c141;
    }
  }
  iVar2 = (int)psVar11;
  psStack_b8 = (secp256k1_fe *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_21();
  a_03 = &sStack_118;
  psStack_c8 = a_01;
  psStack_c0 = psVar26;
  psStack_b8 = unaff_R15;
  secp256k1_modinv64_mul_62(&sStack_f0,(secp256k1_modinv64_signed62 *)a_02,iVar2,1);
  psVar13 = a_00;
  secp256k1_modinv64_mul_62(&sStack_118,a_00,5,uVar8);
  lVar12 = 0;
  while ((ulong)sStack_f0.v[lVar12] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_118.v[lVar12]) goto LAB_0011c1e0;
    lVar12 = lVar12 + 1;
    if (lVar12 == 4) {
      uVar3 = 4;
      while( true ) {
        if (sStack_f0.v[uVar3] < sStack_118.v[uVar3]) {
          return;
        }
        if (sStack_118.v[uVar3] < sStack_f0.v[uVar3]) break;
        bVar29 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar29) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011c1e0:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar12 = a_03->v[0];
  uVar8 = a_03->v[1];
  uVar5 = a_03->v[2];
  uVar7 = a_03->v[3];
  lVar9 = a_03->v[4];
  lVar21 = 0;
  do {
    if (a_03->v[lVar21] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0011c40a:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011c40f;
    }
    if (0x3fffffffffffffff < a_03->v[lVar21]) goto LAB_0011c40a;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  iVar2 = secp256k1_modinv64_mul_cmp_62(a_03,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar2 < 1) {
LAB_0011c40f:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0011c414:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0011c419:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_03,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_0011c414;
    uVar20 = lVar9 >> 0x3f;
    uVar27 = (long)psVar13 >> 0x3f;
    uVar24 = (lVar12 + (uVar20 & 0xfffffffefffffc2f) ^ uVar27) - uVar27;
    uVar28 = ((long)uVar24 >> 0x3e) + ((uVar8 ^ uVar27) - uVar27);
    uVar16 = ((long)uVar28 >> 0x3e) + ((uVar5 ^ uVar27) - uVar27);
    uVar19 = ((long)uVar16 >> 0x3e) + ((uVar7 ^ uVar27) - uVar27);
    lVar12 = ((long)uVar19 >> 0x3e) + (((uVar20 & 0x100) + lVar9 ^ uVar27) - uVar27);
    uVar7 = lVar12 >> 0x3f;
    uVar8 = (uVar7 & 0xfffffffefffffc2f) + (uVar24 & 0x3fffffffffffffff);
    uVar5 = ((long)uVar8 >> 0x3e) + (uVar28 & 0x3fffffffffffffff);
    uVar20 = ((long)uVar5 >> 0x3e) + (uVar16 & 0x3fffffffffffffff);
    uVar24 = ((long)uVar20 >> 0x3e) + (uVar19 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar24 >> 0x3e) + (uVar7 & 0x100) + lVar12;
    a_03->v[0] = uVar8 & 0x3fffffffffffffff;
    a_03->v[1] = uVar5 & 0x3fffffffffffffff;
    a_03->v[2] = uVar20 & 0x3fffffffffffffff;
    a_03->v[3] = uVar24 & 0x3fffffffffffffff;
    a_03->v[4] = uVar7;
    if (0x3fffffffffffffff < uVar7) goto LAB_0011c419;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_03,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(a_03,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_0011c423;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0011c423:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_fe_from_signed62(secp256k1_fe *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t M52 = UINT64_MAX >> 12;
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->n[0] =  a0                   & M52;
    r->n[1] = (a0 >> 52 | a1 << 10) & M52;
    r->n[2] = (a1 >> 42 | a2 << 20) & M52;
    r->n[3] = (a2 >> 32 | a3 << 30) & M52;
    r->n[4] = (a3 >> 22 | a4 << 40);
}